

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_tar_acl.c
# Opt level: O0

void test_compat_solaris_tar_acl(void)

{
  mode_t mVar1;
  archive *v2;
  char **unaff_retaddr;
  wchar_t in_stack_00000008;
  char *name;
  int qual;
  int tag;
  int permset;
  int type;
  char *reference1;
  archive_entry *ae;
  archive *a;
  char *in_stack_000003d0;
  archive *in_stack_ffffffffffffffb8;
  wchar_t want_type;
  void *pvVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  uint in_stack_ffffffffffffffc4;
  wchar_t in_stack_ffffffffffffffc8;
  wchar_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  wchar_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  char *file;
  archive_entry *in_stack_fffffffffffffff0;
  
  file = "test_compat_solaris_tar_acl.tar";
  extract_reference_file(in_stack_000003d0);
  v2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_read_support_format_all(in_stack_ffffffffffffffb8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_read_support_filter_all(in_stack_ffffffffffffffb8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (archive_entry **)in_stack_ffffffffffffffb8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  mVar1 = archive_entry_mode(in_stack_fffffffffffffff0);
  failure("Basic ACLs should set mode to 0644, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(in_stack_fffffffffffffff0);
  want_type = L'\0';
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1452a6,in_stack_fffffffffffffff0);
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             want_type);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1452e6,in_stack_fffffffffffffff0);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145340,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145373,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1453a6,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1453d9,in_stack_fffffffffffffff0);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x14540e,in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pvVar2);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145493,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1454c6,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1454f9,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x14552c,in_stack_fffffffffffffff0);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145561,in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pvVar2);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1455e6,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145619,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x14564c,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x14567f,in_stack_fffffffffffffff0);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1456b4,in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pvVar2);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145739,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x14576c,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x14579f,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1457d2,in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x145805,in_stack_fffffffffffffff0);
  uVar3 = 0;
  assertion_equal_string
            (file,in_stack_ffffffffffffffe4,(char *)in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)((ulong)in_stack_ffffffffffffffc4 << 0x20),unaff_retaddr,in_stack_00000008);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x14589e,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x1458d1,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145904,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145937,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x14596a,
                      in_stack_fffffffffffffff0);
  uVar3 = 0;
  assertion_equal_string
            (file,in_stack_ffffffffffffffe4,(char *)in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)((ulong)in_stack_ffffffffffffffc4 << 0x20),unaff_retaddr,in_stack_00000008);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145a03,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145a36,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145a69,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145a9c,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145acf,
                      in_stack_fffffffffffffff0);
  uVar3 = 0;
  assertion_equal_string
            (file,in_stack_ffffffffffffffe4,(char *)in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)((ulong)in_stack_ffffffffffffffc4 << 0x20),unaff_retaddr,in_stack_00000008);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145b68,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145b9b,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145bce,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145c01,
                      in_stack_fffffffffffffff0);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145c36,
                      in_stack_fffffffffffffff0);
  uVar3 = 0;
  assertion_equal_string
            (file,in_stack_ffffffffffffffe4,(char *)in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)((ulong)in_stack_ffffffffffffffc4 << 0x20),unaff_retaddr,in_stack_00000008);
  archive_entry_acl_next
            (in_stack_fffffffffffffff0,(wchar_t)((ulong)file >> 0x20),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr)
  ;
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145cce,
                      in_stack_fffffffffffffff0);
  archive_read_close((archive *)0x145cd8);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),(longlong)v2,
                      (char *)0x145d07,in_stack_fffffffffffffff0);
  archive_read_free((archive *)0x145d11);
  assertion_equal_int((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),0,(char *)0x145d3f,
                      in_stack_fffffffffffffff0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_solaris_tar_acl)
{
	struct archive *a;
	struct archive_entry *ae;
	const char *reference1 = "test_compat_solaris_tar_acl.tar";
	int type, permset, tag, qual;
	const char *name;

	/* Sample file generated on Solaris 10 */
	extract_reference_file(reference1);
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_filename(a, reference1, 512));

	/* Archive has 1 entry with some ACLs set on it. */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Basic ACLs should set mode to 0644, not %04o",
	    archive_entry_mode(ae)&0777);
	assertEqualInt((archive_entry_mode(ae) & 0777), 0644);
	assertEqualInt(7, archive_entry_acl_reset(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(006, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER_OBJ, tag);
	assertEqualInt(-1, qual);
	assert(name == NULL);

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_GROUP_OBJ, tag);
	assertEqualInt(-1, qual);
	assert(name == NULL);

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_OTHER, tag);
	assertEqualInt(-1, qual);
	assert(name == NULL);

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(001, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER, tag);
	assertEqualInt(71, qual);
	assertEqualString(name, "lp");

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER, tag);
	assertEqualInt(666, qual);
	assertEqualString(name, "666");

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(007, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER, tag);
	assertEqualInt(1000, qual);
	assertEqualString(name, "trasz");

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_MASK, tag);
	assertEqualInt(-1, qual);
	assertEqualString(name, NULL);

	assertEqualInt(ARCHIVE_EOF, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}